

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-database_records_pathway.c
# Opt level: O3

void CGTFS_DatabasePathway(void)

{
  int iVar1;
  feed_db_status_t fVar2;
  feed_db_t db;
  feed_db_t local_240;
  pathway_t local_218;
  
  iVar1 = greatest_test_pre("db_pathway_store");
  if (iVar1 == 0) {
    return;
  }
  iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
  if (iVar1 == 0) {
    memcpy(&local_218,"INDEX456_abc",0x1e8);
    fVar2 = init_feed_db(&local_240,"tests_tdw0.db",1);
    if (fVar2 == FEED_DB_SUCCESS) {
      setup_feed_db(&local_240);
      fVar2 = store_pathway_db(&local_218,&local_240);
      greatest_info.assertions = greatest_info.assertions + 1;
      if (fVar2 == FEED_DB_SUCCESS) {
        fVar2 = free_feed_db(&local_240);
        if (fVar2 == FEED_DB_SUCCESS) {
          greatest_info.msg = (char *)0x0;
          iVar1 = 0;
          goto LAB_00119f62;
        }
        greatest_info.fail_line = 0x24;
        local_240.error_msg = "Failed to free a feed_db_t instance";
      }
      else {
        fwrite("\nExpected: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",1);
        fwrite("\n     Got: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",(ulong)fVar2);
        fputc(10,_stdout);
        greatest_info.fail_line = 0x20;
      }
    }
    else {
      greatest_info.fail_line = 0x1b;
    }
    greatest_info.fail_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_database_records/tests-database_records_pathway.c"
    ;
    iVar1 = -1;
    greatest_info.msg = local_240.error_msg;
    if ((greatest_info.flags & 4) != 0) {
      abort();
    }
  }
LAB_00119f62:
  greatest_test_post(iVar1);
  return;
}

Assistant:

SUITE(CGTFS_DatabasePathway) {
    RUN_TEST(db_pathway_store);
}